

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O0

unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
 __thiscall
pfederc::Parser::fromExprToFunctionParam
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr)

{
  bool bVar1;
  type pEVar2;
  Expr *pEVar3;
  BiOpExpr *in_RDX;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_68;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_60;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [24];
  BiOpExpr *local_28;
  BiOpExpr *biopexpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr_local;
  Parser *this_local;
  
  biopexpr = in_RDX;
  expr_local = expr;
  this_local = this;
  pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                     ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)in_RDX);
  bVar1 = isBiOpExpr(pEVar2,TOK_OP_ASG);
  if (bVar1) {
    pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)biopexpr);
    local_28 = (BiOpExpr *)__dynamic_cast(pEVar2,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
    if (local_28 == (BiOpExpr *)0x0) {
      __cxa_bad_cast();
    }
    pEVar3 = BiOpExpr::getLeft(local_28);
    bVar1 = isBiOpExpr(pEVar3,TOK_OP_BOR);
    if (bVar1) {
      BiOpExpr::getLeftPtr((BiOpExpr *)(local_50 + 8));
      BiOpExpr::getRightPtr((BiOpExpr *)local_50);
      fromExprGuardToFunctionParam
                (this,expr,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_50 + 8));
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_50);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_50 + 8));
    }
    else {
      local_40._6_2_ = 2;
      local_40._0_4_ = 10;
      pEVar3 = BiOpExpr::getLeft(local_28);
      Expr::getPosition(pEVar3);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_40 + 8),(SyntaxErrorCode *)(local_40 + 6),(Position *)local_40);
      generateError((Parser *)(local_40 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)expr);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_40 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_40 + 8));
      std::
      unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
      ::
      unique_ptr<std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>,void>
                ((unique_ptr<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>,std::default_delete<std::tuple<pfederc::Token_const*,bool,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                  *)this,(nullptr_t)0x0);
    }
  }
  else {
    pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)biopexpr);
    bVar1 = isBiOpExpr(pEVar2,TOK_OP_BOR);
    if (bVar1) {
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)&local_58,
                 (nullptr_t)0x0);
      fromExprGuardToFunctionParam
                (this,expr,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)biopexpr);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&local_58);
    }
    else {
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)&local_60,
                 (nullptr_t)0x0);
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)&local_68,
                 (nullptr_t)0x0);
      fromExprDeclToFunctionParam
                (this,expr,
                 (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)biopexpr,
                 &local_60);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&local_68);
      std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&local_60);
    }
  }
  return (__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FuncParameter> Parser::fromExprToFunctionParam(
    std::unique_ptr<Expr> &&expr) noexcept {
  if (isBiOpExpr(*expr, TokenType::TOK_OP_ASG)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    // guard result
    if (!isBiOpExpr(biopexpr.getLeft(), TokenType::TOK_OP_BOR)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_GUARD, biopexpr.getLeft().getPosition()));
      return nullptr;
    }

    return fromExprGuardToFunctionParam(
      biopexpr.getLeftPtr(), biopexpr.getRightPtr());
  } else if (isBiOpExpr(*expr, TokenType::TOK_OP_BOR)) {
    // guard (requires)
    return fromExprGuardToFunctionParam(std::move(expr), nullptr);
  }

  return fromExprDeclToFunctionParam(std::move(expr), nullptr, nullptr);
}